

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O1

U8 __thiscall
SMBusSimulationDataGenerator::OutputByte(SMBusSimulationDataGenerator *this,U8 byte,bool is_ack)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    uVar2 = 0x80;
    do {
      OutputBit(this,(uint)((uVar2 & byte) != 0));
      bVar3 = 1 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar3);
    OutputBit(this,(uint)!is_ack);
    ClockGenerator::AdvanceByTimeS(1.4999999999999999e-05);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
    return byte;
  }
  __assert_fail("mSMBCLK->GetCurrentBitState() == BIT_LOW",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusSimulationDataGenerator.cpp"
                ,0xa4,"U8 SMBusSimulationDataGenerator::OutputByte(const U8, bool)");
}

Assistant:

U8 SMBusSimulationDataGenerator::OutputByte( const U8 byte, bool is_ack )
{
    // SMBCLK must be low
    assert( mSMBCLK->GetCurrentBitState() == BIT_LOW );

    for( int mask = 0x80; mask; mask >>= 1 )
        OutputBit( ( byte & mask ) ? BIT_HIGH : BIT_LOW );

    OutputBit( is_ack ? BIT_LOW : BIT_HIGH );

    // add a small pause
    AdvanceAllBySec( ONE_US * 15 );

    return byte;
}